

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidPolicyMappingTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section10InvalidPolicyMappingTest4
          (Section10InvalidPolicyMappingTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidPolicyMappingTest4) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "P12Mapping1to3CACert",
      "P12Mapping1to3subCACert", "P12Mapping1to3subsubCACert",
      "InvalidPolicyMappingTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "P12Mapping1to3CACRL",
                              "P12Mapping1to3subCACRL",
                              "P12Mapping1to3subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.4";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}